

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcPrePartialsStates
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,double *partials1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  ulong uVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double *local_c0;
  double *local_b0;
  
  uVar8 = this->kStateCount;
  iVar9 = this->kPartialsSize;
  for (lVar15 = 0; (long)iVar9 * 8 != lVar15; lVar15 = lVar15 + 8) {
    *(undefined8 *)((long)destP + lVar15) = 0;
  }
  iVar9 = this->kPartialsPaddedStateCount;
  iVar10 = this->kPatternCount;
  lVar15 = (long)(int)(uVar8 + 1);
  uVar11 = this->kCategoryCount;
  iVar12 = this->kMatrixSize;
  iVar19 = 0;
  local_b0 = matrices1 + 3;
  local_c0 = matrices1;
  for (uVar17 = 0; uVar17 != (~((int)uVar11 >> 0x1f) & uVar11); uVar17 = uVar17 + 1) {
    iVar18 = (iVar10 * (int)uVar17 + startPattern) * iVar9;
    pdVar16 = partials1 + iVar18;
    pdVar25 = destP + iVar18;
    for (lVar21 = (long)startPattern; lVar21 < endPattern; lVar21 = lVar21 + 1) {
      iVar18 = states2[lVar21];
      lVar20 = (long)iVar19;
      pdVar22 = local_c0;
      pdVar24 = local_b0;
      for (uVar23 = 0; uVar23 != (~((int)uVar8 >> 0x1f) & uVar8); uVar23 = uVar23 + 1) {
        dVar1 = matrices2[iVar18 + lVar20];
        lVar26 = 0;
        dVar2 = pdVar16[uVar23];
        pdVar13 = pdVar22;
        pdVar14 = pdVar25;
        while (auVar28._8_8_ = 0, auVar28._0_8_ = dVar1 * dVar2, lVar26 < (int)uVar8 / 4 << 2) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = pdVar24[lVar26 + -3];
          pdVar13 = pdVar13 + 4;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *pdVar14;
          auVar28 = vfmadd213sd_fma(auVar30,auVar28,auVar3);
          *pdVar14 = auVar28._0_8_;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = pdVar24[lVar26 + -2];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pdVar14[1];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar1 * dVar2;
          auVar28 = vfmadd213sd_fma(auVar31,auVar29,auVar4);
          pdVar14[1] = auVar28._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = pdVar24[lVar26 + -1];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pdVar14[2];
          auVar28 = vfmadd213sd_fma(auVar32,auVar29,auVar5);
          pdVar14[2] = auVar28._0_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = pdVar24[lVar26];
          lVar26 = lVar26 + 4;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pdVar14[3];
          auVar28 = vfmadd213sd_fma(auVar33,auVar29,auVar6);
          pdVar14[3] = auVar28._0_8_;
          pdVar14 = pdVar14 + 4;
        }
        for (lVar27 = 0; lVar26 + lVar27 < (long)(int)uVar8; lVar27 = lVar27 + 1) {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *pdVar13;
          pdVar13 = pdVar13 + 1;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar14[lVar27];
          auVar7 = vfmadd213sd_fma(auVar34,auVar28,auVar7);
          pdVar14[lVar27] = auVar7._0_8_;
        }
        lVar20 = lVar20 + lVar15;
        pdVar24 = pdVar24 + lVar15;
        pdVar22 = pdVar22 + lVar15;
      }
      pdVar25 = pdVar25 + iVar9;
      pdVar16 = pdVar16 + iVar9;
    }
    iVar19 = iVar19 + iVar12;
    local_b0 = local_b0 + iVar12;
    local_c0 = local_c0 + iVar12;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                              const REALTYPE* partials1,
                                                              const REALTYPE* matrices1,
                                                              const int* states2,
                                                              const REALTYPE* matrices2,
                                                              int startPattern,
                                                              int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];

        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state2 = states2[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;

                tmpdestPtr = destPtr;
                const REALTYPE  MjPj = matrices2[w + state2] * partials1Ptr[i];

                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }

                w += matrixIncr;
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
        }
    }

}